

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
__thiscall
duckdb::GroupedAggregateHashTable::AcquirePartitionedData(GroupedAggregateHashTable *this)

{
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this_00;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this_01;
  ClientContext *context;
  pointer pPVar1;
  type new_partitioned_data;
  pointer *__ptr;
  GroupedAggregateHashTable *in_RSI;
  
  this_00 = &in_RSI->partitioned_data;
  pPVar1 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator->(this_00);
  PartitionedTupleData::FlushAppendState(pPVar1,&(in_RSI->state).partitioned_append_state);
  pPVar1 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator->(this_00);
  PartitionedTupleData::Unpin(pPVar1);
  if (2 < in_RSI->radix_bits) {
    if ((in_RSI->unpartitioned_data).
        super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
        .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl !=
        (PartitionedTupleData *)0x0) {
      this_01 = &in_RSI->unpartitioned_data;
      pPVar1 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator->(this_01);
      PartitionedTupleData::FlushAppendState(pPVar1,&(in_RSI->state).unpartitioned_append_state);
      pPVar1 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator->(this_01);
      PartitionedTupleData::Unpin(pPVar1);
      pPVar1 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator->(this_01);
      context = in_RSI->context;
      new_partitioned_data =
           unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator*(this_00);
      PartitionedTupleData::Repartition(pPVar1,context,new_partitioned_data);
    }
    InitializeUnpartitionedData(in_RSI);
  }
  (this->super_BaseAggregateHashTable)._vptr_BaseAggregateHashTable =
       (_func_int **)
       (in_RSI->partitioned_data).
       super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
       .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
  (in_RSI->partitioned_data).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
       (PartitionedTupleData *)0x0;
  InitializePartitionedData(in_RSI);
  return (unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
          )(unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
            )this;
}

Assistant:

unique_ptr<PartitionedTupleData> GroupedAggregateHashTable::AcquirePartitionedData() {
	// Flush/unpin partitioned data
	partitioned_data->FlushAppendState(state.partitioned_append_state);
	partitioned_data->Unpin();

	if (radix_bits >= UNPARTITIONED_RADIX_BITS_THRESHOLD) {
		// Flush/unpin unpartitioned data and append to partitioned data
		if (unpartitioned_data) {
			unpartitioned_data->FlushAppendState(state.unpartitioned_append_state);
			unpartitioned_data->Unpin();
			unpartitioned_data->Repartition(context, *partitioned_data);
		}
		InitializeUnpartitionedData();
	}

	// Return and re-initialize
	auto result = std::move(partitioned_data);
	InitializePartitionedData();
	return result;
}